

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sOcclusionQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Stress::OcclusionQueryStressCase::iterate(OcclusionQueryStressCase *this)

{
  Random *rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  TestLog *log;
  qpWatchDog *pqVar3;
  int count;
  int count_00;
  GLint location;
  deUint32 dVar4;
  uint uVar5;
  GLenum err;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  TestError *pTVar9;
  TestLog *pTVar10;
  ulong *puVar11;
  int iVar12;
  int iVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  string sectionName;
  vector<float,_std::allocator<float>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryIds;
  vector<float,_std::allocator<float>_> targetVertices;
  vector<float,_std::allocator<float>_> occluderVertices;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryResultReady;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryResult;
  string local_2f8;
  long *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  vector<float,_std::allocator<float>_> local_2b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a0;
  vector<float,_std::allocator<float>_> local_288;
  vector<float,_std::allocator<float>_> local_268;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  ScopedLogSection local_228;
  long local_220;
  TestLog local_218;
  long lStack_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  deUint64 local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  location = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_2a0,(long)this->m_numQueries,(value_type_conflict4 *)local_1b0,
             (allocator_type *)&local_2d8);
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_208,(long)this->m_numQueries,(value_type_conflict4 *)local_1b0,
             (allocator_type *)&local_2d8);
  local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,(long)this->m_numQueries,(value_type_conflict4 *)local_1b0,
             (allocator_type *)&local_2d8);
  iVar13 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar13 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0x1c3bca8);
  pTVar10 = (TestLog *)(plVar6 + 2);
  if ((TestLog *)*plVar6 == pTVar10) {
    local_218.m_log = pTVar10->m_log;
    lStack_210 = plVar6[3];
    local_228.m_log = &local_218;
  }
  else {
    local_218.m_log = pTVar10->m_log;
    local_228.m_log = (TestLog *)*plVar6;
  }
  local_220 = plVar6[1];
  *plVar6 = (long)pTVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_228);
  paVar1 = &local_2f8.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_2f8.field_2._M_allocated_capacity = *puVar11;
    local_2f8.field_2._8_8_ = plVar6[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *puVar11;
    local_2f8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2f8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    uVar14 = local_2f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_240 + local_2f8._M_string_length) {
    uVar8 = 0xf;
    if (local_248 != local_238) {
      uVar8 = local_238[0];
    }
    if (local_240 + local_2f8._M_string_length <= uVar8) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_248,0,(char *)0x0,(ulong)local_2f8._M_dataplus._M_p);
      goto LAB_013b4aa4;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_248);
LAB_013b4aa4:
  local_2d8 = &local_2c8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_2c8 = *plVar6;
    uStack_2c0 = puVar7[3];
  }
  else {
    local_2c8 = *plVar6;
    local_2d8 = (long *)*puVar7;
  }
  local_2d0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_228.m_log != &local_218) {
    operator_delete(local_228.m_log,(ulong)((long)&(local_218.m_log)->flags + 1));
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,(char *)local_2d8,(allocator<char> *)local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,(char *)local_2d8,(allocator<char> *)&local_248);
  tcu::ScopedLogSection::ScopedLogSection(&local_228,log,(string *)local_1b0,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Parameters:\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"- Number of occlusion queries: ",0x1f);
  std::ostream::operator<<(poVar2,this->m_numQueries);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"- Number of occluder draws per query: ",0x26);
  std::ostream::operator<<(poVar2,this->m_numOccluderDraws);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,", primitives per draw: ",0x17);
  std::ostream::operator<<(poVar2,this->m_numOccludersPerDraw);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"- Number of target draws per query: ",0x24);
  std::ostream::operator<<(poVar2,this->m_numTargetDraws);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,", primitives per draw: ",0x17);
  std::ostream::operator<<(poVar2,this->m_numTargetsPerDraw);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,".\n",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  iVar13 = this->m_numOccludersPerDraw;
  iVar15 = this->m_numTargetsPerDraw;
  std::vector<float,_std::allocator<float>_>::resize(&local_2b8,400);
  count = iVar13 * 3;
  count_00 = iVar15 * 3;
  rnd = &this->m_rnd;
  lVar16 = 0;
  do {
    fVar18 = deRandom_getFloat(&rnd->m_rnd);
    *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar16) = fVar18 + fVar18 + -1.0;
    fVar18 = deRandom_getFloat(&rnd->m_rnd);
    *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar16 + 4) = fVar18 + fVar18 + -1.0;
    fVar18 = deRandom_getFloat(&rnd->m_rnd);
    *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar16 + 8) = fVar18 + 0.0;
    *(undefined4 *)
     ((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + lVar16 + 0xc) = 0x3f800000;
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x640);
  std::vector<float,_std::allocator<float>_>::resize
            (&local_268,(long)(this->m_numOccluderDraws * iVar13 * 0xc));
  if (0 < this->m_numOccluderDraws * count) {
    iVar12 = 3;
    lVar16 = 0;
    do {
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      uVar8 = (ulong)(dVar4 % 100 << 4);
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + -3] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8);
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + -2] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 + 4);
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + -1] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 + 8);
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 + 0xc);
      lVar16 = lVar16 + 1;
      iVar12 = iVar12 + 4;
    } while (lVar16 < this->m_numOccluderDraws * count);
  }
  std::vector<float,_std::allocator<float>_>::resize
            (&local_288,(long)(this->m_numTargetDraws * iVar15 * 0xc));
  if (0 < this->m_numTargetDraws * count_00) {
    iVar12 = 3;
    lVar16 = 0;
    do {
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      uVar8 = (ulong)(dVar4 % 100 << 4);
      local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + -3] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8);
      local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + -2] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 + 4);
      local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + -1] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 + 8);
      local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12] =
           *(float *)((long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 + 0xc);
      lVar16 = lVar16 + 1;
      iVar12 = iVar12 + 4;
    } while (lVar16 < this->m_numTargetDraws * count_00);
  }
  if (this->m_program != (ShaderProgram *)0x0) {
    glwClearColor(0.0,0.0,0.0,1.0);
    glwClearDepthf(1.0);
    glwClear(0x4100);
    glwEnable(0xb71);
    glwUseProgram((this->m_program->m_program).m_program);
    glwEnableVertexAttribArray(0);
    local_1f0 = deGetMicroseconds();
    if (0 < this->m_numQueries) {
      lVar16 = 0;
      do {
        glwUniform4f(location,0.0,0.0,1.0,1.0);
        if (0 < this->m_numOccluderDraws) {
          iVar12 = 0;
          lVar17 = 0;
          do {
            glwVertexAttribPointer
                      (0,4,0x1406,'\0',0,
                       local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar12);
            glwDrawArrays(4,0,count);
            lVar17 = lVar17 + 1;
            iVar12 = iVar12 + iVar13 * 3;
          } while (lVar17 < this->m_numOccluderDraws);
        }
        glwGenQueries(1,local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar16);
        glwBeginQuery(this->m_queryMode,
                      local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar16]);
        glwUniform4f(location,1.0,0.0,0.0,1.0);
        if (0 < this->m_numTargetDraws) {
          iVar12 = 0;
          lVar17 = 0;
          do {
            glwVertexAttribPointer
                      (0,4,0x1406,'\0',0,
                       local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar12);
            glwDrawArrays(4,0,count_00);
            lVar17 = lVar17 + 1;
            iVar12 = iVar12 + iVar15 * 3;
          } while (lVar17 < this->m_numTargetDraws);
        }
        glwEndQuery(this->m_queryMode);
        uVar5 = (int)lVar16 * -0x3d70a3d7;
        if (((uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f) < 0x51eb852) &&
           (pqVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog,
           pqVar3 != (qpWatchDog *)0x0)) {
          qpWatchDog_touch(pqVar3);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < this->m_numQueries);
    }
    glwFinish();
    glwDisable(0xb71);
    deGetMicroseconds();
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Total duration: ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," ms",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    iVar13 = this->m_numQueries;
    if (0 < iVar13) {
      iVar15 = 0;
      lVar16 = 0;
      uVar8 = 0;
      do {
        glwGetQueryObjectuiv
                  (*(GLuint *)
                    ((long)local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16),0x8867,
                   (GLuint *)
                   ((long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar16));
        if (*(int *)((long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16) != 1) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Occlusion query failed to return a result after glFinish()",(char *)0x0
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
                     ,0x10d);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        glwGetQueryObjectuiv
                  (*(GLuint *)
                    ((long)local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16),0x8866,
                   (GLuint *)
                   ((long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar16));
        if (((int)(uVar8 / 0x32) * 0x32 + iVar15 == 0) &&
           (pqVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog,
           pqVar3 != (qpWatchDog *)0x0)) {
          qpWatchDog_touch(pqVar3);
        }
        uVar5 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar5;
        iVar13 = this->m_numQueries;
        lVar16 = lVar16 + 4;
        iVar15 = iVar15 + -1;
      } while ((int)uVar5 < iVar13);
    }
    glwDeleteQueries(iVar13,local_2a0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    err = glwGetError();
    glu::checkError(err,"Occlusion queries finished",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
                    ,0x114);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Case passed!",0xc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    iVar13 = this->m_iterNdx + 1;
    this->m_iterNdx = iVar13;
    tcu::TestLog::endSection(local_228.m_log);
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (GLuint *)0x0) {
      operator_delete(local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (IterateResult)(iVar13 < 3);
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,"m_program",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
             ,0xce);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

OcclusionQueryStressCase::IterateResult OcclusionQueryStressCase::iterate (void)
{
	tcu::TestLog&				log				 = m_testCtx.getLog();
	deUint32					colorUnif		 = glGetUniformLocation(m_program->getProgram(), "u_color");

	std::vector<float>			vertices;
	std::vector<float>			occluderVertices;
	std::vector<float>			targetVertices;
	std::vector<deUint32>		queryIds		 (m_numQueries, 0);
	std::vector<deUint32>		queryResultReady (m_numQueries, 0);
	std::vector<deUint32>		queryResult		 (m_numQueries, 0);

	std::string					sectionName		("Case iteration " + de::toString(m_iterNdx+1) + "/" + de::toString(NUM_CASE_ITERATIONS));
	tcu::ScopedLogSection		section			(log, sectionName.c_str(), sectionName.c_str());

	log << tcu::TestLog::Message << "Parameters:\n"
								 << "- Number of occlusion queries: "		 << m_numQueries		<< ".\n"
								 << "- Number of occluder draws per query: " << m_numOccluderDraws	<< ", primitives per draw: " << m_numOccludersPerDraw << ".\n"
								 << "- Number of target draws per query: "	 << m_numTargetDraws	<< ", primitives per draw: " << m_numTargetsPerDraw	  << ".\n"
		<< tcu::TestLog::EndMessage;

	int numOccluderIndicesPerDraw = 3*m_numOccludersPerDraw;
	int numTargetIndicesPerDraw = 3*m_numTargetsPerDraw;

	// Generate vertex data

	vertices.resize(4*NUM_GENERATED_VERTICES);

	for (int i = 0; i < NUM_GENERATED_VERTICES; i++)
	{
		vertices[4*i    ] = m_rnd.getFloat(-1.0f, 1.0f);
		vertices[4*i + 1] = m_rnd.getFloat(-1.0f, 1.0f);
		vertices[4*i + 2] = m_rnd.getFloat(0.0f, 1.0f);
		vertices[4*i + 3] = 1.0f;
	}

	// Generate primitives

	occluderVertices.resize(4*numOccluderIndicesPerDraw * m_numOccluderDraws);

	for (int i = 0; i < numOccluderIndicesPerDraw * m_numOccluderDraws; i++)
	{
		int vtxNdx = m_rnd.getInt(0, NUM_GENERATED_VERTICES-1);
		occluderVertices[4*i    ] = vertices[4*vtxNdx];
		occluderVertices[4*i + 1] = vertices[4*vtxNdx + 1];
		occluderVertices[4*i + 2] = vertices[4*vtxNdx + 2];
		occluderVertices[4*i + 3] = vertices[4*vtxNdx + 3];
	}

	targetVertices.resize(4*numTargetIndicesPerDraw * m_numTargetDraws);

	for (int i = 0; i < numTargetIndicesPerDraw * m_numTargetDraws; i++)
	{
		int vtxNdx = m_rnd.getInt(0, NUM_GENERATED_VERTICES-1);
		targetVertices[4*i    ] = vertices[4*vtxNdx];
		targetVertices[4*i + 1] = vertices[4*vtxNdx + 1];
		targetVertices[4*i + 2] = vertices[4*vtxNdx + 2];
		targetVertices[4*i + 3] = vertices[4*vtxNdx + 3];
	}

	TCU_CHECK(m_program);

	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glClearDepthf				(1.0f);
	glClear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	glEnable					(GL_DEPTH_TEST);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(0);

	deUint64 time = deGetMicroseconds();

	for (int queryIter = 0; queryIter < m_numQueries; queryIter++)
	{
		// Draw occluders

		glUniform4f	(colorUnif, OCCLUDER_COLOR.x(), OCCLUDER_COLOR.y(), OCCLUDER_COLOR.z(), OCCLUDER_COLOR.w());

		for (int drawIter = 0; drawIter < m_numOccluderDraws; drawIter++)
		{
			glVertexAttribPointer	(0, 4, GL_FLOAT, GL_FALSE, 0, &occluderVertices[drawIter * numOccluderIndicesPerDraw]);
			glDrawArrays			(GL_TRIANGLES, 0, numOccluderIndicesPerDraw);
		}

		// Begin occlusion query

		glGenQueries	(1, &queryIds[queryIter]);
		glBeginQuery	(m_queryMode, queryIds[queryIter]);

		// Draw targets

		glUniform4f	(colorUnif, TARGET_COLOR.x(), TARGET_COLOR.y(), TARGET_COLOR.z(), TARGET_COLOR.w());

		for (int drawIter = 0; drawIter < m_numTargetDraws; drawIter++)
		{
			glVertexAttribPointer	(0, 4, GL_FLOAT, GL_FALSE, 0, &targetVertices[drawIter * numTargetIndicesPerDraw]);
			glDrawArrays			(GL_TRIANGLES, 0, numTargetIndicesPerDraw);
		}

		// End occlusion query

		glEndQuery		(m_queryMode);

		if ((queryIter % WATCHDOG_INTERVAL) == 0 && m_testCtx.getWatchDog())
			qpWatchDog_touch(m_testCtx.getWatchDog());
	}

	glFinish();
	glDisable(GL_DEPTH_TEST);

	deUint64 dTime = deGetMicroseconds() - time;
	log << tcu::TestLog::Message << "Total duration: " << dTime/1000 << " ms" << tcu::TestLog::EndMessage;

	// Get results

	for (int queryIter = 0; queryIter < m_numQueries; queryIter++)
	{
		glGetQueryObjectuiv(queryIds[queryIter], GL_QUERY_RESULT_AVAILABLE, &queryResultReady[queryIter]);

		if (queryResultReady[queryIter] == GL_TRUE)
		{
			glGetQueryObjectuiv(queryIds[queryIter], GL_QUERY_RESULT, &queryResult[queryIter]);
		}
		else
			TCU_FAIL("Occlusion query failed to return a result after glFinish()");

		if ((queryIter % WATCHDOG_INTERVAL) == 0 && m_testCtx.getWatchDog())
			qpWatchDog_touch(m_testCtx.getWatchDog());
	}

	glDeleteQueries	(m_numQueries, &queryIds[0]);
	GLU_CHECK_MSG	("Occlusion queries finished");

	log << tcu::TestLog::Message << "Case passed!" << tcu::TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}